

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O0

void rgbcx::encode_bc1_pick_initial
               (color32 *pSrc_pixels,uint32_t flags,bool grayscale_flag,int min_r,int min_g,
               int min_b,int max_r,int max_g,int max_b,int avg_r,int avg_g,int avg_b,int total_r,
               int total_g,int total_b,int *lr,int *lg,int *lb,int *hr,int *hg,int *hb)

{
  bool bVar1;
  vec3F xh;
  vec3F xl;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint *puVar7;
  uint32_t in_ECX;
  byte in_DL;
  uint in_ESI;
  byte *in_RDI;
  uint32_t in_R8D;
  uint32_t in_R9D;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  uint in_stack_00000008;
  uint in_stack_00000010;
  uint in_stack_00000018;
  int max_d;
  int min_d;
  int max_d23;
  int min_d23;
  int max_d01;
  int min_d01;
  int dot3;
  int dot2;
  int dot1;
  int dot0;
  uint32_t i_7;
  int high_dot;
  int low_dot;
  float m;
  float k;
  float b_6;
  float g_6;
  float r_6;
  uint32_t power_iter;
  uint32_t total_power_iters;
  uint32_t i_6;
  float cov [6];
  float xb;
  float xg;
  float xr;
  int saxis_b;
  int saxis_g;
  int saxis_r;
  int b_5;
  int g_5;
  int r_5;
  uint32_t i_5;
  int icov [6];
  uint32_t high_c;
  uint32_t low_c;
  int y1;
  int x1;
  int y0;
  int x0;
  int b_4;
  int g_4;
  int r_4;
  uint32_t i_4;
  int icov_yz_1;
  int icov_xz_1;
  int inset_b_1;
  int inset_g_1;
  int inset_r_1;
  int b_3;
  int g_3;
  int r_3;
  uint32_t i_3;
  int icov_yz;
  int icov_xz;
  float inset_b;
  float inset_g;
  float inset_r;
  float bias;
  vec3F h_1;
  vec3F l_1;
  float fmax_chan_val_2;
  float fmin_chan_val_2;
  float d_2;
  float dg_1;
  float dr_1;
  float a_y_1;
  float a_x_1;
  float b_y_1;
  float b_x_1;
  float div_2;
  int sum_x2_2;
  int sum_x_2;
  int b_2;
  int g_2;
  int r_2;
  uint32_t i_2;
  float fmax_chan_val_1;
  float fmin_chan_val_1;
  float d_1;
  float db_1;
  float dr;
  float a_z_1;
  float a_x;
  float b_z_1;
  float b_x;
  float div_1;
  int sum_x2_1;
  int sum_x_1;
  int b_1;
  int g_1;
  int r_1;
  uint32_t i_1;
  float fmax_chan_val;
  float fmin_chan_val;
  float d;
  float db;
  float dg;
  float a_z;
  float a_y;
  float b_z;
  float b_y;
  float div;
  int sum_x2;
  int sum_x;
  int b;
  int g;
  int r;
  uint32_t i;
  vec3F h;
  vec3F l;
  int sum_xy_b;
  int sum_xy_g;
  int sum_xy_r;
  int max_chan_val;
  int min_chan_val;
  int big_chan;
  int fr;
  undefined8 in_stack_fffffffffffffd68;
  undefined8 in_stack_fffffffffffffd70;
  int *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd84;
  int in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  int in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  int in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  int in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  int local_258;
  uint local_254;
  uint local_250;
  uint local_24c;
  float local_248;
  undefined4 in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  float in_stack_fffffffffffffdc4;
  uint local_234;
  uint local_22c;
  float in_stack_fffffffffffffdd8;
  float in_stack_fffffffffffffddc;
  float in_stack_fffffffffffffde0;
  float local_21c;
  float local_218;
  float local_214;
  float local_210;
  float local_20c;
  float local_208;
  int local_204;
  int local_200;
  int local_1fc;
  uint local_1ec;
  int local_1e8 [7];
  uint local_1cc;
  uint local_1c8;
  uint local_1c4;
  uint local_1c0;
  uint local_1bc;
  uint local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  uint local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  int local_188;
  uint local_184;
  int local_180;
  int local_17c;
  float local_178;
  float local_174;
  float local_170;
  undefined4 local_16c;
  vec3F local_168;
  vec3F local_15c;
  undefined8 local_150;
  float local_148;
  undefined8 local_140;
  float local_138;
  undefined8 local_130;
  float local_128;
  undefined8 local_120;
  float local_118;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  int local_e8;
  int local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  int local_a8;
  int local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  int local_68;
  int local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  float local_50;
  float fStack_4c;
  float local_48;
  float local_44;
  float fStack_40;
  float local_3c;
  int local_38;
  int local_34;
  int local_30;
  uint32_t local_2c;
  uint32_t local_28;
  uint local_24;
  uint32_t local_20;
  uint local_1c;
  uint local_18;
  uint32_t local_14;
  byte local_d;
  uint local_c;
  byte *local_8;
  
  fVar11 = (float)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  local_d = in_DL & 1;
  local_14 = in_ECX;
  if (local_d == 0) {
    if ((in_ESI & 0x200) == 0) {
      local_8 = in_RDI;
      if ((in_ESI & 0x40) == 0) {
        if ((in_ESI & 0x8000) == 0) {
          local_1c8 = 0;
          local_1cc = 0;
          local_1c = in_R9D;
          local_18 = in_R8D;
          local_c = in_ESI;
          memset(local_1e8,0,0x18);
          for (local_1ec = 0; local_1ec < 0x10; local_1ec = local_1ec + 1) {
            iVar3 = (uint)local_8[(ulong)local_1ec * 4] - min_d;
            iVar4 = (uint)local_8[(ulong)local_1ec * 4 + 1] - min_d23;
            iVar5 = (uint)local_8[(ulong)local_1ec * 4 + 2] - min_d01;
            local_1e8[0] = iVar3 * iVar3 + local_1e8[0];
            local_1e8[1] = iVar3 * iVar4 + local_1e8[1];
            local_1e8[2] = iVar3 * iVar5 + local_1e8[2];
            local_1e8[3] = iVar4 * iVar4 + local_1e8[3];
            local_1e8[4] = iVar4 * iVar5 + local_1e8[4];
            local_1e8[5] = iVar5 * iVar5 + local_1e8[5];
          }
          local_1fc = 0x132;
          local_200 = 0x259;
          local_204 = 0x75;
          local_208 = (float)(int)(in_stack_00000008 - local_14);
          local_20c = (float)(int)(in_stack_00000010 - local_18);
          local_210 = (float)(int)(in_stack_00000018 - local_1c);
          if (local_1e8[2] < 0) {
            local_208 = -local_208;
          }
          if (local_1e8[4] < 0) {
            local_20c = -local_20c;
          }
          for (local_22c = 0; local_22c < 6; local_22c = local_22c + 1) {
            *(float *)(&stack0xfffffffffffffdd8 + (ulong)local_22c * 4) =
                 (float)local_1e8[local_22c] * 0.003921569;
          }
          uVar6 = 4;
          if ((local_c & 0x800) != 0) {
            uVar6 = 6;
          }
          for (local_234 = 0; local_234 < uVar6; local_234 = local_234 + 1) {
            fVar8 = local_20c * in_stack_fffffffffffffddc;
            fVar9 = local_210 * in_stack_fffffffffffffde0;
            fVar10 = local_210 * local_218;
            local_210 = local_210 * local_214 +
                        local_208 * in_stack_fffffffffffffde0 + local_20c * local_218;
            local_20c = fVar10 + local_208 * in_stack_fffffffffffffddc + local_20c * local_21c;
            local_208 = fVar9 + local_208 * in_stack_fffffffffffffdd8 + fVar8;
          }
          fVar11 = maximum<float>((float)((ulong)in_stack_fffffffffffffd70 >> 0x20),
                                  (float)in_stack_fffffffffffffd70,fVar11);
          if (2.0 <= fVar11) {
            local_248 = 2048.0 / fVar11;
            local_1fc = (int)(local_208 * local_248);
            local_200 = (int)(local_20c * local_248);
            local_204 = (int)(local_210 * local_248);
          }
          local_24c = 0x7fffffff;
          local_250 = 0x80000000;
          for (local_254 = 0; local_254 < 0x10; local_254 = local_254 + 4) {
            local_258 = (uint)local_8[(ulong)local_254 * 4] * local_1fc * 0x10 +
                        (uint)local_8[(ulong)local_254 * 4 + 1] * local_200 * 0x10 +
                        (uint)local_8[(ulong)local_254 * 4 + 2] * local_204 * 0x10 + local_254;
            std::min<int>(&local_258,(int *)&stack0xfffffffffffffda4);
            std::max<int>(&local_258,(int *)&stack0xfffffffffffffda4);
            std::min<int>((int *)&stack0xfffffffffffffda0,(int *)&stack0xfffffffffffffd9c);
            std::max<int>((int *)&stack0xfffffffffffffda0,(int *)&stack0xfffffffffffffd9c);
            std::min<int>((int *)&stack0xfffffffffffffd98,(int *)&stack0xfffffffffffffd90);
            std::max<int>((int *)&stack0xfffffffffffffd94,(int *)&stack0xfffffffffffffd8c);
            puVar7 = (uint *)std::min<int>((int *)&local_24c,(int *)&stack0xfffffffffffffd88);
            local_24c = *puVar7;
            puVar7 = (uint *)std::max<int>((int *)&local_250,(int *)&stack0xfffffffffffffd84);
            local_250 = *puVar7;
          }
          local_1c8 = local_24c & 0xf;
          local_1cc = local_250 & 0xf;
          bVar2 = to_5((uint)local_8[(ulong)local_1c8 * 4]);
          *_m = (uint)bVar2;
          bVar2 = to_6((uint)local_8[(ulong)local_1c8 * 4 + 1]);
          *_b_6 = (uint)bVar2;
          bVar2 = to_5((uint)local_8[(ulong)local_1c8 * 4 + 2]);
          *_r_6 = (uint)bVar2;
          bVar2 = to_5((uint)local_8[(ulong)local_1cc * 4]);
          *_total_power_iters = (uint)bVar2;
          bVar2 = to_6((uint)local_8[(ulong)local_1cc * 4 + 1]);
          *(uint *)cov._0_8_ = (uint)bVar2;
          bVar2 = to_5((uint)local_8[(ulong)local_1cc * 4 + 2]);
          *(uint *)cov._8_8_ = (uint)bVar2;
        }
        else {
          local_194 = (int)((in_stack_00000008 - in_ECX) + -8) >> 4;
          local_198 = (int)((in_stack_00000010 - in_R8D) + -8) >> 4;
          local_19c = (int)((in_stack_00000018 - in_R9D) + -8) >> 4;
          local_14 = local_194 + in_ECX;
          local_18 = local_198 + in_R8D;
          local_1c = local_19c + in_R9D;
          if (0xff < (local_14 | local_18 | local_1c)) {
            local_14 = clampi(local_14,0,0xff);
            local_18 = clampi(local_18,0,0xff);
            local_1c = clampi(local_1c,0,0xff);
          }
          in_stack_00000008 = in_stack_00000008 - local_194;
          in_stack_00000010 = in_stack_00000010 - local_198;
          in_stack_00000018 = in_stack_00000018 - local_19c;
          if (0xff < (in_stack_00000008 | in_stack_00000010 | in_stack_00000018)) {
            in_stack_00000008 = clampi(in_stack_00000008,0,0xff);
            in_stack_00000010 = clampi(in_stack_00000010,0,0xff);
            in_stack_00000018 = clampi(in_stack_00000018,0,0xff);
          }
          local_1a0 = 0;
          local_1a4 = 0;
          for (local_1a8 = 0; local_1a8 < 0x10; local_1a8 = local_1a8 + 1) {
            local_1ac = (uint)local_8[(ulong)local_1a8 * 4] - min_d;
            local_1b0 = (uint)local_8[(ulong)local_1a8 * 4 + 1] - min_d23;
            local_1b4 = (uint)local_8[(ulong)local_1a8 * 4 + 2] - min_d01;
            local_1a0 = local_1ac * local_1b4 + local_1a0;
            local_1a4 = local_1b0 * local_1b4 + local_1a4;
          }
          local_1b8 = local_14;
          local_1bc = local_18;
          local_1c0 = in_stack_00000008;
          local_1c4 = in_stack_00000010;
          if (local_1a0 < 0) {
            std::swap<int>((int *)&local_1b8,(int *)&local_1c0);
          }
          if (local_1a4 < 0) {
            std::swap<int>((int *)&local_1bc,(int *)&local_1c4);
          }
          bVar2 = to_5(local_1b8);
          *_m = (uint)bVar2;
          bVar2 = to_6(local_1bc);
          *_b_6 = (uint)bVar2;
          bVar2 = to_5(local_1c);
          *_r_6 = (uint)bVar2;
          bVar2 = to_5(local_1c0);
          *_total_power_iters = (uint)bVar2;
          bVar2 = to_6(local_1c4);
          *(uint *)cov._0_8_ = (uint)bVar2;
          bVar2 = to_5(in_stack_00000018);
          *(uint *)cov._8_8_ = (uint)bVar2;
        }
      }
      else {
        local_15c.c[0] = (float)(int)in_ECX * 0.003921569;
        local_15c.c[1] = (float)(int)in_R8D * 0.003921569;
        local_15c.c[2] = (float)(int)in_R9D * 0.003921569;
        local_168.c[0] = (float)(int)in_stack_00000008 * 0.003921569;
        local_168.c[1] = (float)(int)in_stack_00000010 * 0.003921569;
        local_168.c[2] = (float)(int)in_stack_00000018 * 0.003921569;
        local_16c = 0x3d008081;
        local_170 = ((local_168.c[0] - local_15c.c[0]) - 0.03137255) * 0.0625;
        local_174 = ((local_168.c[1] - local_15c.c[1]) - 0.03137255) * 0.0625;
        local_178 = ((local_168.c[2] - local_15c.c[2]) - 0.03137255) * 0.0625;
        local_15c.c[0] = clampf(local_15c.c[0] + local_170,0.0,1.0);
        local_15c.c[1] = clampf(local_15c.c[1] + local_174,0.0,1.0);
        local_15c.c[2] = clampf(local_15c.c[2] + local_178,0.0,1.0);
        local_168.c[0] = clampf(local_168.c[0] - local_170,0.0,1.0);
        local_168.c[1] = clampf(local_168.c[1] - local_174,0.0,1.0);
        local_168.c[2] = clampf(local_168.c[2] - local_178,0.0,1.0);
        local_17c = 0;
        local_180 = 0;
        for (local_184 = 0; local_184 < 0x10; local_184 = local_184 + 1) {
          local_188 = (uint)local_8[(ulong)local_184 * 4] - min_d;
          local_18c = (uint)local_8[(ulong)local_184 * 4 + 1] - min_d23;
          local_190 = (uint)local_8[(ulong)local_184 * 4 + 2] - min_d01;
          local_17c = local_188 * local_190 + local_17c;
          local_180 = local_18c * local_190 + local_180;
        }
        if (local_17c < 0) {
          std::swap<float>(local_15c.c,local_168.c);
        }
        if (local_180 < 0) {
          std::swap<float>(local_15c.c + 1,local_168.c + 1);
        }
        precise_round_565(&local_15c,&local_168,(int *)_m,(int *)_b_6,(int *)_r_6,
                          (int *)_total_power_iters,(int *)cov._0_8_,(int *)cov._8_8_);
      }
    }
    else {
      local_2c = in_stack_00000008;
      bVar1 = (int)(in_stack_00000008 - in_ECX) < (int)(in_stack_00000010 - in_R8D);
      local_28 = in_ECX;
      if (bVar1) {
        local_2c = in_stack_00000010;
        local_28 = in_R8D;
      }
      local_24 = (uint)bVar1;
      if ((int)(local_2c - local_28) < (int)(in_stack_00000018 - in_R9D)) {
        local_24 = 2;
        local_2c = in_stack_00000018;
        local_28 = in_R9D;
      }
      local_30 = 0;
      local_34 = 0;
      local_38 = 0;
      if (local_24 == 0) {
        for (local_54 = 0; local_54 < 0x10; local_54 = local_54 + 1) {
          local_58 = (uint)in_RDI[(ulong)local_54 * 4];
          local_5c = (uint)in_RDI[(ulong)local_54 * 4 + 1];
          local_60 = (uint)in_RDI[(ulong)local_54 * 4 + 2];
          local_30 = local_58 * local_58 + local_30;
          local_34 = local_58 * local_5c + local_34;
          local_38 = local_58 * local_60 + local_38;
        }
        local_64 = dot2;
        local_68 = local_30;
        local_6c = (float)(local_30 * 0x10 - dot2 * dot2);
        local_70 = 0.0;
        local_74 = 0.0;
        dVar12 = std::fabs((double)(ulong)(uint)local_6c);
        if (1e-08 < SUB84(dVar12,0)) {
          local_6c = 1.0 / local_6c;
          local_70 = (float)(local_34 * 0x10 - local_64 * dot0) * local_6c;
          local_74 = (float)(local_38 * 0x10 - local_64 * high_dot) * local_6c;
        }
        local_78 = (-local_70 * (float)local_64 + (float)dot0) / 16.0;
        local_7c = (-local_74 * (float)local_64 + (float)high_dot) / 16.0;
        fStack_40 = local_70 * (float)(int)local_28 + local_78;
        local_3c = local_74 * (float)(int)local_28 + local_7c;
        local_80 = (local_70 * (float)(int)local_2c + local_78) - fStack_40;
        local_84 = (local_74 * (float)(int)local_2c + local_7c) - local_3c;
        fStack_4c = local_80 * 0.9375 + fStack_40;
        local_48 = local_84 * 0.9375 + local_3c;
        fStack_40 = local_80 * 0.0625 + fStack_40;
        local_3c = local_84 * 0.0625 + local_3c;
        local_88 = (float)(int)(local_2c - local_28);
        local_8c = local_88 * 0.0625 + (float)(int)local_28;
        local_90 = local_88 * 0.9375 + (float)(int)local_28;
        local_50 = local_90;
        local_44 = local_8c;
      }
      else if (local_24 == 1) {
        for (local_94 = 0; local_94 < 0x10; local_94 = local_94 + 1) {
          local_98 = (uint)in_RDI[(ulong)local_94 * 4];
          local_9c = (uint)in_RDI[(ulong)local_94 * 4 + 1];
          local_a0 = (uint)in_RDI[(ulong)local_94 * 4 + 2];
          local_30 = local_9c * local_98 + local_30;
          local_34 = local_9c * local_9c + local_34;
          local_38 = local_9c * local_a0 + local_38;
        }
        local_a4 = dot0;
        local_a8 = local_34;
        local_ac = (float)(local_34 * 0x10 - dot0 * dot0);
        local_b0 = 0.0;
        local_b4 = 0.0;
        dVar12 = std::fabs((double)(ulong)(uint)local_ac);
        if (1e-08 < SUB84(dVar12,0)) {
          local_ac = 1.0 / local_ac;
          local_b0 = (float)(local_30 * 0x10 - local_a4 * dot2) * local_ac;
          local_b4 = (float)(local_38 * 0x10 - local_a4 * high_dot) * local_ac;
        }
        local_b8 = (-local_b0 * (float)local_a4 + (float)dot2) / 16.0;
        local_bc = (-local_b4 * (float)local_a4 + (float)high_dot) / 16.0;
        local_44 = local_b0 * (float)(int)local_28 + local_b8;
        local_3c = local_b4 * (float)(int)local_28 + local_bc;
        local_c0 = (local_b0 * (float)(int)local_2c + local_b8) - local_44;
        local_c4 = (local_b4 * (float)(int)local_2c + local_bc) - local_3c;
        local_50 = local_c0 * 0.9375 + local_44;
        local_48 = local_c4 * 0.9375 + local_3c;
        local_44 = local_c0 * 0.0625 + local_44;
        local_3c = local_c4 * 0.0625 + local_3c;
        local_c8 = (float)(int)(local_2c - local_28);
        local_cc = local_c8 * 0.0625 + (float)(int)local_28;
        local_d0 = local_c8 * 0.9375 + (float)(int)local_28;
        fStack_4c = local_d0;
        fStack_40 = local_cc;
      }
      else {
        for (local_d4 = 0; local_d4 < 0x10; local_d4 = local_d4 + 1) {
          local_d8 = (uint)in_RDI[(ulong)local_d4 * 4];
          local_dc = (uint)in_RDI[(ulong)local_d4 * 4 + 1];
          local_e0 = (uint)in_RDI[(ulong)local_d4 * 4 + 2];
          local_30 = local_e0 * local_d8 + local_30;
          local_34 = local_e0 * local_dc + local_34;
          local_38 = local_e0 * local_e0 + local_38;
        }
        local_e4 = high_dot;
        local_e8 = local_38;
        local_ec = (float)(local_38 * 0x10 - high_dot * high_dot);
        local_f0 = 0.0;
        local_f4 = 0.0;
        dVar12 = std::fabs((double)(ulong)(uint)local_ec);
        if (1e-08 < SUB84(dVar12,0)) {
          local_ec = 1.0 / local_ec;
          local_f0 = (float)(local_30 * 0x10 - local_e4 * dot2) * local_ec;
          local_f4 = (float)(local_34 * 0x10 - local_e4 * dot0) * local_ec;
        }
        local_f8 = (-local_f0 * (float)local_e4 + (float)dot2) / 16.0;
        local_fc = (-local_f4 * (float)local_e4 + (float)dot0) / 16.0;
        local_44 = local_f0 * (float)(int)local_28 + local_f8;
        fStack_40 = local_f4 * (float)(int)local_28 + local_fc;
        local_100 = (local_f0 * (float)(int)local_2c + local_f8) - local_44;
        local_104 = (local_f4 * (float)(int)local_2c + local_fc) - fStack_40;
        local_50 = local_100 * 0.9375 + local_44;
        fStack_4c = local_104 * 0.9375 + fStack_40;
        local_44 = local_100 * 0.0625 + local_44;
        fStack_40 = local_104 * 0.0625 + fStack_40;
        local_108 = (float)(int)(local_2c - local_28);
        local_10c = local_108 * 0.0625 + (float)(int)local_28;
        local_110 = local_108 * 0.9375 + (float)(int)local_28;
        local_48 = local_110;
        local_3c = local_10c;
      }
      local_118 = local_3c;
      local_140 = CONCAT44(fStack_40,local_44);
      local_128 = local_48;
      local_150 = CONCAT44(fStack_4c,local_50);
      local_138 = local_3c;
      local_148 = local_48;
      xl.c[1] = in_stack_fffffffffffffddc;
      xl.c[0] = in_stack_fffffffffffffdd8;
      xl.c[2] = in_stack_fffffffffffffde0;
      xh.c[1] = (float)in_stack_fffffffffffffdc0;
      xh.c[0] = (float)in_stack_fffffffffffffdbc;
      xh.c[2] = in_stack_fffffffffffffdc4;
      local_130 = local_150;
      local_120 = local_140;
      precise_round_565_noscale
                (xl,xh,(int *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 (int *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                 (int *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 (int *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 (int *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 in_stack_fffffffffffffd78);
    }
  }
  else {
    local_20 = (uint32_t)*in_RDI;
    if ((int)(in_stack_00000008 - in_ECX) < 2) {
      bVar2 = to_5(local_20);
      *(uint *)cov._8_8_ = (uint)bVar2;
      *_total_power_iters = (uint)bVar2;
      *_r_6 = (uint)bVar2;
      *_m = (uint)bVar2;
      bVar2 = to_6(local_20);
      *(uint *)cov._0_8_ = (uint)bVar2;
      *_b_6 = (uint)bVar2;
    }
    else {
      bVar2 = to_5(in_ECX);
      *_r_6 = (uint)bVar2;
      *_m = (uint)bVar2;
      bVar2 = to_6(local_14);
      *_b_6 = (uint)bVar2;
      bVar2 = to_5(in_stack_00000008);
      *(uint *)cov._8_8_ = (uint)bVar2;
      *_total_power_iters = (uint)bVar2;
      bVar2 = to_6(in_stack_00000008);
      *(uint *)cov._0_8_ = (uint)bVar2;
    }
  }
  return;
}

Assistant:

static inline void encode_bc1_pick_initial(const color32 *pSrc_pixels, uint32_t flags, bool grayscale_flag,
			int min_r, int min_g, int min_b, int max_r, int max_g, int max_b, 
			int avg_r, int avg_g, int avg_b, int total_r, int total_g, int total_b,
			int &lr, int &lg, int &lb, int &hr, int &hg, int &hb)
	{
		if (grayscale_flag) 
		{
			const int fr = pSrc_pixels[0].r;

			// Grayscale blocks are a common enough case to specialize.
			if ((max_r - min_r) < 2)
			{
				lr = lb = hr = hb = to_5(fr);
				lg = hg = to_6(fr);
			}
			else
			{
				lr = lb = to_5(min_r);
				lg = to_6(min_r);

				hr = hb = to_5(max_r);
				hg = to_6(max_r);
			}
		}
		else if (flags & cEncodeBC1Use2DLS)
		{
			//  2D Least Squares approach from Humus's example, with added inset and optimal rounding.
			int big_chan = 0, min_chan_val = min_r, max_chan_val = max_r;
			if ((max_g - min_g) > (max_chan_val - min_chan_val))
				big_chan = 1, min_chan_val = min_g, max_chan_val = max_g;

			if ((max_b - min_b) > (max_chan_val - min_chan_val))
				big_chan = 2, min_chan_val = min_b, max_chan_val = max_b;
		
			int sum_xy_r = 0, sum_xy_g = 0, sum_xy_b = 0;
			vec3F l, h;
			if (big_chan == 0)
			{
				for (uint32_t i = 0; i < 16; i++)
				{
					const int r = pSrc_pixels[i].r, g = pSrc_pixels[i].g, b = pSrc_pixels[i].b;
					sum_xy_r += r * r, sum_xy_g += r * g, sum_xy_b += r * b;
				}

				int sum_x = total_r;
				int sum_x2 = sum_xy_r;

				float div = (float)(16 * sum_x2 - sum_x * sum_x);
				float b_y = 0.0f, b_z = 0.0f;
				if (fabs(div) > 1e-8f)
				{
					div = 1.0f / div;
					b_y = (16 * sum_xy_g - sum_x * total_g) * div;
					b_z = (16 * sum_xy_b - sum_x * total_b) * div;
				}

				float a_y = (total_g - b_y * sum_x) / 16.0f;
				float a_z = (total_b - b_z * sum_x) / 16.0f;
								
				l.c[1] = a_y + b_y * min_chan_val;
				l.c[2] = a_z + b_z * min_chan_val;

				h.c[1] = a_y + b_y * max_chan_val;
				h.c[2] = a_z + b_z * max_chan_val;

				float dg = (h.c[1] - l.c[1]);
				float db = (h.c[2] - l.c[2]);
				
				h.c[1] = l.c[1] + dg * (15.0f/16.0f);
				h.c[2] = l.c[2] + db * (15.0f/16.0f);

				l.c[1] = l.c[1] + dg * (1.0f/16.0f);
				l.c[2] = l.c[2] + db * (1.0f/16.0f);
								
				float d = (float)(max_chan_val - min_chan_val);
				float fmin_chan_val = min_chan_val + d * (1.0f/16.0f);
				float fmax_chan_val = min_chan_val + d * (15.0f/16.0f);

				l.c[0] = fmin_chan_val;
				h.c[0] = fmax_chan_val;
			}
			else if (big_chan == 1)
			{
				for (uint32_t i = 0; i < 16; i++)
				{
					const int r = pSrc_pixels[i].r, g = pSrc_pixels[i].g, b = pSrc_pixels[i].b;
					sum_xy_r += g * r, sum_xy_g += g * g, sum_xy_b += g * b;
				}

				int sum_x = total_g;
				int sum_x2 = sum_xy_g;

				float div = (float)(16 * sum_x2 - sum_x * sum_x);
				float b_x = 0.0f, b_z = 0.0f;
				if (fabs(div) > 1e-8f)
				{
					div = 1.0f / div;
					b_x = (16 * sum_xy_r - sum_x * total_r) * div;
					b_z = (16 * sum_xy_b - sum_x * total_b) * div;
				}

				float a_x = (total_r - b_x * sum_x) / 16.0f;
				float a_z = (total_b - b_z * sum_x) / 16.0f;

				l.c[0] = a_x + b_x * min_chan_val;
				l.c[2] = a_z + b_z * min_chan_val;

				h.c[0] = a_x + b_x * max_chan_val;
				h.c[2] = a_z + b_z * max_chan_val;

				float dr = (h.c[0] - l.c[0]);
				float db = (h.c[2] - l.c[2]);
				
				h.c[0] = l.c[0] + dr * (15.0f/16.0f);
				h.c[2] = l.c[2] + db * (15.0f/16.0f);

				l.c[0] = l.c[0] + dr * (1.0f/16.0f);
				l.c[2] = l.c[2] + db * (1.0f/16.0f);
								
				float d = (float)(max_chan_val - min_chan_val);
				float fmin_chan_val = min_chan_val + d * (1.0f/16.0f);
				float fmax_chan_val = min_chan_val + d * (15.0f/16.0f);

				l.c[1] = fmin_chan_val;
				h.c[1] = fmax_chan_val;
			}
			else
			{
				for (uint32_t i = 0; i < 16; i++)
				{
					const int r = pSrc_pixels[i].r, g = pSrc_pixels[i].g, b = pSrc_pixels[i].b;
					sum_xy_r += b * r, sum_xy_g += b * g, sum_xy_b += b * b;
				}

				int sum_x = total_b;
				int sum_x2 = sum_xy_b;

				float div = (float)(16 * sum_x2 - sum_x * sum_x);
				float b_x = 0.0f, b_y = 0.0f;
				if (fabs(div) > 1e-8f)
				{
					div = 1.0f / div;
					b_x = (16 * sum_xy_r - sum_x * total_r) * div;
					b_y = (16 * sum_xy_g - sum_x * total_g) * div;
				}

				float a_x = (total_r - b_x * sum_x) / 16.0f;
				float a_y = (total_g - b_y * sum_x) / 16.0f;

				l.c[0] = a_x + b_x * min_chan_val;
				l.c[1] = a_y + b_y * min_chan_val;

				h.c[0] = a_x + b_x * max_chan_val;
				h.c[1] = a_y + b_y * max_chan_val;

				float dr = (h.c[0] - l.c[0]);
				float dg = (h.c[1] - l.c[1]);
				
				h.c[0] = l.c[0] + dr * (15.0f/16.0f);
				h.c[1] = l.c[1] + dg * (15.0f/16.0f);

				l.c[0] = l.c[0] + dr * (1.0f/16.0f);
				l.c[1] = l.c[1] + dg * (1.0f/16.0f);

				float d = (float)(max_chan_val - min_chan_val);
				float fmin_chan_val = min_chan_val + d * (1.0f/16.0f);
				float fmax_chan_val = min_chan_val + d * (15.0f/16.0f);

				l.c[2] = fmin_chan_val;
				h.c[2] = fmax_chan_val;
			}

			precise_round_565_noscale(l, h, lr, lg, lb, hr, hg, hb);
		}
		else if (flags & cEncodeBC1BoundingBox)
		{
			// Algorithm from icbc.h compress_dxt1_fast()
			vec3F l, h;
			l.c[0] = min_r * (1.0f/255.0f);
			l.c[1] = min_g * (1.0f/255.0f);
			l.c[2] = min_b * (1.0f/255.0f);

			h.c[0] = max_r * (1.0f/255.0f);
			h.c[1] = max_g * (1.0f/255.0f);
			h.c[2] = max_b * (1.0f/255.0f);

			const float bias = 8.0f / 255.0f;
			float inset_r = (h.c[0] - l.c[0] - bias) * (1.0f/16.0f);
			float inset_g = (h.c[1] - l.c[1] - bias) * (1.0f/16.0f);
			float inset_b = (h.c[2] - l.c[2] - bias) * (1.0f/16.0f);
			
			l.c[0] = clampf(l.c[0] + inset_r, 0.0f, 1.0f);
			l.c[1] = clampf(l.c[1] + inset_g, 0.0f, 1.0f);
			l.c[2] = clampf(l.c[2] + inset_b, 0.0f, 1.0f);

			h.c[0] = clampf(h.c[0] - inset_r, 0.0f, 1.0f);
			h.c[1] = clampf(h.c[1] - inset_g, 0.0f, 1.0f);
			h.c[2] = clampf(h.c[2] - inset_b, 0.0f, 1.0f);

			int icov_xz = 0, icov_yz = 0;
			for (uint32_t i = 0; i < 16; i++)
			{
				int r = (int)pSrc_pixels[i].r - avg_r;
				int g = (int)pSrc_pixels[i].g - avg_g;
				int b = (int)pSrc_pixels[i].b - avg_b;
				icov_xz += r * b;
				icov_yz += g * b;
			}
						 
			 if (icov_xz < 0)
				  std::swap(l.c[0], h.c[0]);

			 if (icov_yz < 0)
				  std::swap(l.c[1], h.c[1]);

			 precise_round_565(l, h, lr, lg, lb, hr, hg, hb);
		}
		else if (flags & cEncodeBC1BoundingBoxInt)
		{
			// Algorithm from icbc.h compress_dxt1_fast(), but converted to integer.
			int inset_r = (max_r - min_r - 8) >> 4;
			int inset_g = (max_g - min_g - 8) >> 4;
			int inset_b = (max_b - min_b - 8) >> 4;

			min_r += inset_r;
			min_g += inset_g;
			min_b += inset_b;
			if ((uint32_t)(min_r | min_g | min_b) > 255U)
			{
				min_r = clampi(min_r, 0, 255);
				min_g = clampi(min_g, 0, 255);
				min_b = clampi(min_b, 0, 255);
			}

			max_r -= inset_r;
			max_g -= inset_g;
			max_b -= inset_b;
			if ((uint32_t)(max_r | max_g | max_b) > 255U)
			{
				max_r = clampi(max_r, 0, 255);
				max_g = clampi(max_g, 0, 255);
				max_b = clampi(max_b, 0, 255);
			}

			int icov_xz = 0, icov_yz = 0;
			for (uint32_t i = 0; i < 16; i++)
			{
				int r = (int)pSrc_pixels[i].r - avg_r;
				int g = (int)pSrc_pixels[i].g - avg_g;
				int b = (int)pSrc_pixels[i].b - avg_b;
				icov_xz += r * b;
				icov_yz += g * b;
			}

			 int x0 = min_r;
			 int y0 = min_g;
			 int x1 = max_r;
			 int y1 = max_g;

			 if (icov_xz < 0)
				  std::swap(x0, x1);

			 if (icov_yz < 0)
				  std::swap(y0, y1);
			 
			 lr = to_5(x0);
			 lg = to_6(y0);
			 lb = to_5(min_b);

			 hr = to_5(x1);
			 hg = to_6(y1);
			 hb = to_5(max_b);
		}
		else
		{
			// Select 2 colors along the principle axis. (There must be a faster/simpler way.)
			uint32_t low_c = 0, high_c = 0;

			int icov[6] = { 0, 0, 0, 0, 0, 0 };
			for (uint32_t i = 0; i < 16; i++)
			{
				int r = (int)pSrc_pixels[i].r - avg_r;
				int g = (int)pSrc_pixels[i].g - avg_g;
				int b = (int)pSrc_pixels[i].b - avg_b;
				icov[0] += r * r;
				icov[1] += r * g;
				icov[2] += r * b;
				icov[3] += g * g;
				icov[4] += g * b;
				icov[5] += b * b;
			}
			
			int saxis_r = 306, saxis_g = 601, saxis_b = 117;

			float xr = (float)(max_r - min_r);
			float xg = (float)(max_g - min_g);
			float xb = (float)(max_b - min_b);

			if (icov[2] < 0)
				xr = -xr;

			if (icov[4] < 0)
				xg = -xg;
						
			float cov[6];
			for (uint32_t i = 0; i < 6; i++)
				cov[i] = (float)(icov[i]) * (1.0f / 255.0f);

			const uint32_t total_power_iters = (flags & cEncodeBC1Use6PowerIters) ? 6 : 4;
			for (uint32_t power_iter = 0; power_iter < total_power_iters; power_iter++)
			{
				float r = xr * cov[0] + xg * cov[1] + xb * cov[2];
				float g = xr * cov[1] + xg * cov[3] + xb * cov[4];
				float b = xr * cov[2] + xg * cov[4] + xb * cov[5];
				xr = r; xg = g; xb = b;
			}

			float k = maximum(fabsf(xr), fabsf(xg), fabsf(xb));
			if (k >= 2)
			{
				float m = 2048.0f / k;
				saxis_r = (int)(xr * m);
				saxis_g = (int)(xg * m);
				saxis_b = (int)(xb * m);
			}
												
			int low_dot = INT_MAX, high_dot = INT_MIN;

			saxis_r = (int)((uint32_t)saxis_r << 4U);
			saxis_g = (int)((uint32_t)saxis_g << 4U);
			saxis_b = (int)((uint32_t)saxis_b << 4U);
			
			for (uint32_t i = 0; i < 16; i += 4)
			{
				int dot0 = ((pSrc_pixels[i].r * saxis_r + pSrc_pixels[i].g * saxis_g + pSrc_pixels[i].b * saxis_b) & ~0xF) + i;
				int dot1 = ((pSrc_pixels[i + 1].r * saxis_r + pSrc_pixels[i + 1].g * saxis_g + pSrc_pixels[i + 1].b * saxis_b) & ~0xF) + i + 1;
				int dot2 = ((pSrc_pixels[i + 2].r * saxis_r + pSrc_pixels[i + 2].g * saxis_g + pSrc_pixels[i + 2].b * saxis_b) & ~0xF) + i + 2;
				int dot3 = ((pSrc_pixels[i + 3].r * saxis_r + pSrc_pixels[i + 3].g * saxis_g + pSrc_pixels[i + 3].b * saxis_b) & ~0xF) + i + 3;

				int min_d01 = std::min(dot0, dot1);
				int max_d01 = std::max(dot0, dot1);

				int min_d23 = std::min(dot2, dot3);
				int max_d23 = std::max(dot2, dot3);

				int min_d = std::min(min_d01, min_d23);
				int max_d = std::max(max_d01, max_d23);

				low_dot = std::min(low_dot, min_d);
				high_dot = std::max(high_dot, max_d);
			}
			low_c = low_dot & 15;
			high_c = high_dot & 15;

			lr = to_5(pSrc_pixels[low_c].r);
			lg = to_6(pSrc_pixels[low_c].g);
			lb = to_5(pSrc_pixels[low_c].b);

			hr = to_5(pSrc_pixels[high_c].r);
			hg = to_6(pSrc_pixels[high_c].g);
			hb = to_5(pSrc_pixels[high_c].b);
		}
	}